

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void __thiscall Js::ConfigFlagsTable::TranslateFlagConfiguration(ConfigFlagsTable *this)

{
  bool *pbVar1;
  code *pcVar2;
  bool bVar3;
  Number NVar4;
  int iVar5;
  char *message;
  int iVar6;
  char *error;
  int iVar7;
  uint lineNumber;
  int iVar8;
  undefined4 *puVar9;
  undefined8 *in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c VerifyExecutionModeLimits;
  Number local_30;
  uint autoProfilingInterpreter0Limit;
  uint profilingInterpreter0Limit;
  uint autoProfilingInterpreter1Limit;
  uint simpleJitLimit;
  uint profilingInterpreter1Limit;
  
  local_40.this = this;
  TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()(&local_40);
  if (this->ForceDynamicProfile == true) {
    (this->Force).phaseList[0x141].valid = true;
  }
  if (this->ForceJITLoopBody == true) {
    (this->Force).phaseList[0x143].valid = true;
  }
  if (this->NoDeferParse == true) {
    (this->Off).phaseList[7].valid = true;
  }
  if ((((this->flagPresent[0x115] != false) || (this->flagPresent[0x117] == true)) &&
      (this->flagPresent[0x130] == false)) && (this->flagPresent[0x132] == false)) {
    if ((this->Off).phaseList[0x149].valid == true) {
      this->flagPresent[0x132] = true;
      if (this->flagPresent[0x117] == true) {
        NVar4 = this->MaxInterpretCount;
      }
      else {
        NVar4 = this->MinInterpretCount;
      }
      this->FullJitAfter = NVar4;
    }
    else {
      this->flagPresent[0x130] = true;
      bVar3 = this->flagPresent[0x117];
      this->SimpleJitAfter = (&this->MinInterpretCount)[(ulong)bVar3 * 2];
      if (((this->flagPresent[0x115] == true) && (this->flagPresent[0x116] != false)) ||
         (this->flagPresent[0x119] == true)) {
        this->flagPresent[0x132] = true;
        iVar5 = this->SimpleJitAfter;
        this->FullJitAfter = iVar5;
        if (this->flagPresent[0x119] == true) {
          this->FullJitAfter = iVar5 + this->MaxSimpleJitRunCount;
        }
        else {
          this->FullJitAfter = iVar5 + this->MinSimpleJitRunCount;
          if (bVar3 != false) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)*in_FS_OFFSET;
            *puVar9 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                        ,0x250,"(dontEnforceLimitsForSimpleJitAfterOrFullJitAfter)",
                                        "dontEnforceLimitsForSimpleJitAfterOrFullJitAfter");
            if (!bVar3) goto LAB_001e903a;
            *puVar9 = 0;
          }
        }
      }
    }
  }
  if (((this->flagPresent[0x127] != false) || (this->flagPresent[0x128] != false)) ||
     ((this->flagPresent[0x129] != false ||
      ((this->flagPresent[0x12a] != false || (this->flagPresent[299] != false))))))
  goto LAB_001e8fbc;
  pbVar1 = this->flagPresent + 0x127;
  if (this->flagPresent[300] == true) {
    iVar5 = PAL_swscanf((this->ExecutionModeLimits).pszValue,L"%u.%u.%u.%u.%u",
                        (undefined1 *)((long)&VerifyExecutionModeLimits.this + 4),&local_30,
                        &autoProfilingInterpreter0Limit,&profilingInterpreter0Limit,
                        &autoProfilingInterpreter1Limit);
    if (iVar5 != 5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)*in_FS_OFFSET;
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                  ,0x272,"(scannedCount == 5)","scannedCount == 5");
      if (!bVar3) goto LAB_001e903a;
      *puVar9 = 0;
    }
    this->flagPresent[299] = true;
    pbVar1[0] = true;
    pbVar1[1] = true;
    pbVar1[2] = true;
    pbVar1[3] = true;
    this->AutoProfilingInterpreter0Limit = VerifyExecutionModeLimits.this._4_4_;
    this->ProfilingInterpreter0Limit = local_30;
    this->AutoProfilingInterpreter1Limit = autoProfilingInterpreter0Limit;
    this->SimpleJitLimit = profilingInterpreter0Limit;
    this->ProfilingInterpreter1Limit = autoProfilingInterpreter1Limit;
    goto LAB_001e8fbc;
  }
  if (this->NewSimpleJit == false) {
    this->AutoProfilingInterpreter0Limit = 0xc;
    this->ProfilingInterpreter0Limit = 4;
    this->AutoProfilingInterpreter1Limit = 0x44;
    this->SimpleJitLimit = 0x15;
    this->ProfilingInterpreter1Limit = 0;
    TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()(&local_40);
  }
  if (this->flagPresent[0x130] == true) {
    this->flagPresent[0x127] = true;
    this->flagPresent[0x128] = true;
    this->flagPresent[0x129] = true;
    this->flagPresent[0x12e] = true;
    iVar5 = this->SimpleJitAfter;
    iVar6 = this->ProfilingInterpreter0Limit;
    if (iVar5 <= this->ProfilingInterpreter0Limit) {
      iVar6 = iVar5;
    }
    this->ProfilingInterpreter0Limit = iVar6;
    this->AutoProfilingInterpreter0Limit = iVar5 - iVar6;
    this->AutoProfilingInterpreter1Limit = 0;
    if (this->flagPresent[0x132] == true) {
      this->flagPresent[0x12a] = true;
      this->flagPresent[299] = true;
      if (this->FullJitAfter < iVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)*in_FS_OFFSET;
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x2a6,"(SimpleJitAfter <= FullJitAfter)",
                                    "SimpleJitAfter <= FullJitAfter");
        if (!bVar3) goto LAB_001e903a;
        *puVar9 = 0;
      }
      iVar5 = this->FullJitAfter;
      iVar6 = iVar5 - this->SimpleJitAfter;
      iVar8 = (this->NewSimpleJit ^ 1) * 9 + 0x10;
      if (iVar8 < iVar5) {
        iVar5 = iVar8;
      }
      iVar5 = iVar5 - this->ProfilingInterpreter0Limit;
      if (this->NewSimpleJit == 1) {
        iVar8 = this->ProfilingInterpreter1Limit;
        if (iVar6 <= this->ProfilingInterpreter1Limit) {
          iVar8 = iVar6;
        }
        this->ProfilingInterpreter1Limit = iVar8;
        this->SimpleJitLimit = iVar6 - iVar8;
      }
      else {
        this->SimpleJitLimit = iVar6;
        iVar8 = iVar6;
        if (iVar5 <= iVar6) {
          iVar8 = iVar5;
        }
        this->ProfilingInterpreter1Limit = 0;
      }
      iVar5 = iVar5 - iVar8;
      if (iVar5 != 0) {
        iVar6 = this->AutoProfilingInterpreter0Limit;
        iVar8 = this->AutoProfilingInterpreter1Limit;
        iVar7 = iVar5;
        if (iVar8 < iVar5) {
          iVar7 = iVar8;
        }
        this->AutoProfilingInterpreter1Limit = iVar8 - iVar7;
        iVar5 = iVar5 - iVar7;
        iVar8 = iVar5;
        if (iVar6 < iVar5) {
          iVar8 = iVar6;
        }
        this->AutoProfilingInterpreter0Limit = iVar6 - iVar8;
        this->ProfilingInterpreter0Limit = iVar8 + this->ProfilingInterpreter0Limit + iVar7;
        if (iVar6 < iVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)*in_FS_OFFSET;
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                      ,0x2c8,"(profilingIterationsNeeded == 0)",
                                      "profilingIterationsNeeded == 0");
          if (!bVar3) goto LAB_001e903a;
          *puVar9 = 0;
        }
      }
      if (this->ProfilingInterpreter0Limit + this->AutoProfilingInterpreter0Limit +
          this->AutoProfilingInterpreter1Limit + this->SimpleJitLimit +
          this->ProfilingInterpreter1Limit != this->FullJitAfter) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)*in_FS_OFFSET;
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x2d2,
                                    "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter)"
                                    ,
                                    "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter"
                                   );
        if (!bVar3) goto LAB_001e903a;
        *puVar9 = 0;
      }
    }
    if (this->ProfilingInterpreter0Limit + this->AutoProfilingInterpreter0Limit +
        this->AutoProfilingInterpreter1Limit != this->SimpleJitAfter) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)*in_FS_OFFSET;
      *puVar9 = 1;
      error = 
      "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit ) == SimpleJitAfter)"
      ;
      message = 
      "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit ) == SimpleJitAfter"
      ;
      lineNumber = 0x2da;
LAB_001e8fa1:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                  ,lineNumber,error,message);
      if (!bVar3) {
LAB_001e903a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
  }
  else {
    if (this->flagPresent[0x132] != true) {
      if ((this->flagPresent[0x123] == true) && (-1 < this->MaxTemplatizedJitRunCount)) {
        this->MinTemplatizedJitRunCount = this->MaxTemplatizedJitRunCount;
      }
      if ((this->flagPresent[0x125] == true) && (-1 < this->MaxAsmJsInterpreterRunCount)) {
        this->MinAsmJsInterpreterRunCount = this->MaxAsmJsInterpreterRunCount;
      }
      goto LAB_001e8fbc;
    }
    this->flagPresent[0x12e] = true;
    this->flagPresent[299] = true;
    pbVar1[0] = true;
    pbVar1[1] = true;
    pbVar1[2] = true;
    pbVar1[3] = true;
    iVar5 = this->FullJitAfter;
    if (this->NewSimpleJit == true) {
      iVar6 = this->ProfilingInterpreter1Limit;
      if (iVar5 <= this->ProfilingInterpreter1Limit) {
        iVar6 = iVar5;
      }
      this->ProfilingInterpreter1Limit = iVar6;
    }
    else {
      this->ProfilingInterpreter1Limit = 0;
      iVar6 = this->SimpleJitLimit;
      if (iVar5 <= this->SimpleJitLimit) {
        iVar6 = iVar5;
      }
      this->SimpleJitLimit = iVar6;
    }
    iVar6 = iVar5 - iVar6;
    iVar8 = this->ProfilingInterpreter0Limit;
    if (iVar6 <= this->ProfilingInterpreter0Limit) {
      iVar8 = iVar6;
    }
    this->ProfilingInterpreter0Limit = iVar8;
    iVar6 = iVar6 - iVar8;
    if (this->NewSimpleJit != false) {
      iVar7 = this->SimpleJitLimit;
      if (iVar6 <= this->SimpleJitLimit) {
        iVar7 = iVar6;
      }
      this->SimpleJitLimit = iVar7;
      iVar6 = iVar6 - iVar7;
    }
    iVar7 = this->AutoProfilingInterpreter0Limit;
    if (iVar6 <= this->AutoProfilingInterpreter0Limit) {
      iVar7 = iVar6;
    }
    this->AutoProfilingInterpreter0Limit = iVar7;
    this->AutoProfilingInterpreter1Limit = iVar6 - iVar7;
    if (iVar8 + iVar6 + this->SimpleJitLimit + this->ProfilingInterpreter1Limit != iVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)*in_FS_OFFSET;
      *puVar9 = 1;
      error = 
      "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter)"
      ;
      message = 
      "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter"
      ;
      lineNumber = 0x306;
      goto LAB_001e8fa1;
    }
  }
  this->EnforceExecutionModeLimits = true;
LAB_001e8fbc:
  if (((this->Prejit != false) || (this->ForceNative == true)) && (this->NoNative == false)) {
    this->flagPresent[0x127] = true;
    this->flagPresent[0x128] = true;
    this->flagPresent[0x129] = true;
    this->flagPresent[0x12e] = true;
    this->AutoProfilingInterpreter0Limit = 0;
    this->ProfilingInterpreter0Limit = 0;
    this->AutoProfilingInterpreter1Limit = 0;
    if ((this->Off).phaseList[0x149].valid == true) {
      this->flagPresent[0x12a] = true;
      this->flagPresent[299] = true;
      this->SimpleJitLimit = 0;
      this->ProfilingInterpreter1Limit = 0;
    }
    this->EnforceExecutionModeLimits = true;
  }
  TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()(&local_40);
  return;
}

Assistant:

void ConfigFlagsTable::TranslateFlagConfiguration()
    {
        const auto VerifyExecutionModeLimits = [this]()
        {
            const Number zero = static_cast<Number>(0);
            const Number maxUint8 = static_cast<Number>(static_cast<uint8>(-1)); // entry point call count is uint8
            const Number maxUint16 = static_cast<Number>(static_cast<uint16>(-1));

        #if ENABLE_DEBUG_CONFIG_OPTIONS
            Assert(MinInterpretCount >= zero);
            Assert(MinInterpretCount <= maxUint16);
            Assert(MaxInterpretCount >= zero);
            Assert(MaxInterpretCount <= maxUint16);
            Assert(MinSimpleJitRunCount >= zero);
            Assert(MinSimpleJitRunCount <= maxUint8);
            Assert(MaxSimpleJitRunCount >= zero);
            Assert(MaxSimpleJitRunCount <= maxUint8);

            Assert(SimpleJitAfter >= zero);
            Assert(SimpleJitAfter <= maxUint8);
            Assert(FullJitAfter >= zero);
            Assert(FullJitAfter <= maxUint16);
        #endif

            Assert(AutoProfilingInterpreter0Limit >= zero);
            Assert(AutoProfilingInterpreter0Limit <= maxUint16);
            Assert(ProfilingInterpreter0Limit >= zero);
            Assert(ProfilingInterpreter0Limit <= maxUint16);
            Assert(AutoProfilingInterpreter1Limit >= zero);
            Assert(AutoProfilingInterpreter1Limit <= maxUint16);
            Assert(SimpleJitLimit >= zero);
            Assert(SimpleJitLimit <= maxUint8);
            Assert(ProfilingInterpreter1Limit >= zero);
            Assert(ProfilingInterpreter1Limit <= maxUint16);
            Assert(
                (
                    AutoProfilingInterpreter0Limit +
                    ProfilingInterpreter0Limit +
                    AutoProfilingInterpreter1Limit +
                    SimpleJitLimit +
                    ProfilingInterpreter1Limit
                ) <= maxUint16);
        };
        VerifyExecutionModeLimits();

    #if ENABLE_DEBUG_CONFIG_OPTIONS
    #if !DISABLE_JIT
        if(ForceDynamicProfile)
        {
            Force.Enable(DynamicProfilePhase);
        }
        if(ForceJITLoopBody)
        {
            Force.Enable(JITLoopBodyPhase);
        }
    #endif
        if(NoDeferParse)
        {
            Off.Enable(DeferParsePhase);
        }
    #endif

    #if ENABLE_DEBUG_CONFIG_OPTIONS && !DISABLE_JIT
        bool dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = false;
        if((IsEnabled(MinInterpretCountFlag) || IsEnabled(MaxInterpretCountFlag)) &&
            !(IsEnabled(SimpleJitAfterFlag) || IsEnabled(FullJitAfterFlag)))
        {
            if(Off.IsEnabled(SimpleJitPhase))
            {
                Enable(FullJitAfterFlag);
                if(IsEnabled(MaxInterpretCountFlag))
                {
                    FullJitAfter = MaxInterpretCount;
                }
                else
                {
                    FullJitAfter = MinInterpretCount;
                    dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = true;
                }
            }
            else
            {
                Enable(SimpleJitAfterFlag);
                if(IsEnabled(MaxInterpretCountFlag))
                {
                    SimpleJitAfter = MaxInterpretCount;
                }
                else
                {
                    SimpleJitAfter = MinInterpretCount;
                    dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = true;
                }
                if((IsEnabled(MinInterpretCountFlag) && IsEnabled(MinSimpleJitRunCountFlag)) ||
                    IsEnabled(MaxSimpleJitRunCountFlag))
                {
                    Enable(FullJitAfterFlag);
                    FullJitAfter = SimpleJitAfter;
                    if(IsEnabled(MaxSimpleJitRunCountFlag))
                    {
                        FullJitAfter += MaxSimpleJitRunCount;
                    }
                    else
                    {
                        FullJitAfter += MinSimpleJitRunCount;
                        Assert(dontEnforceLimitsForSimpleJitAfterOrFullJitAfter);
                    }
                }
            }
        }

        // Configure execution mode limits
        do
        {
            if(IsEnabled(AutoProfilingInterpreter0LimitFlag) ||
                IsEnabled(ProfilingInterpreter0LimitFlag) ||
                IsEnabled(AutoProfilingInterpreter1LimitFlag) ||
                IsEnabled(SimpleJitLimitFlag) ||
                IsEnabled(ProfilingInterpreter1LimitFlag))
            {
                break;
            }

            if(IsEnabled(ExecutionModeLimitsFlag))
            {
                uint autoProfilingInterpreter0Limit;
                uint profilingInterpreter0Limit;
                uint autoProfilingInterpreter1Limit;
                uint simpleJitLimit;
                uint profilingInterpreter1Limit;
                const int scannedCount =
                    swscanf_s(
                        static_cast<LPCWSTR>(ExecutionModeLimits),
                        _u("%u.%u.%u.%u.%u"),
                        &autoProfilingInterpreter0Limit,
                        &profilingInterpreter0Limit,
                        &autoProfilingInterpreter1Limit,
                        &simpleJitLimit,
                        &profilingInterpreter1Limit);
                Assert(scannedCount == 5);

                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);

                AutoProfilingInterpreter0Limit = autoProfilingInterpreter0Limit;
                ProfilingInterpreter0Limit = profilingInterpreter0Limit;
                AutoProfilingInterpreter1Limit = autoProfilingInterpreter1Limit;
                SimpleJitLimit = simpleJitLimit;
                ProfilingInterpreter1Limit = profilingInterpreter1Limit;
                break;
            }

            if(!NewSimpleJit)
            {
                // Use the defaults for old simple JIT. The flags are not enabled here because the values can be changed later
                // based on other flags, only the defaults values are adjusted here.
                AutoProfilingInterpreter0Limit = DEFAULT_CONFIG_AutoProfilingInterpreter0Limit;
                ProfilingInterpreter0Limit = DEFAULT_CONFIG_ProfilingInterpreter0Limit;
                CompileAssert(
                    DEFAULT_CONFIG_AutoProfilingInterpreter0Limit <= DEFAULT_CONFIG_AutoProfilingInterpreterLimit_OldSimpleJit);
                AutoProfilingInterpreter1Limit =
                    DEFAULT_CONFIG_AutoProfilingInterpreterLimit_OldSimpleJit - DEFAULT_CONFIG_AutoProfilingInterpreter0Limit;
                CompileAssert(DEFAULT_CONFIG_ProfilingInterpreter0Limit <= DEFAULT_CONFIG_SimpleJitLimit_OldSimpleJit);
                SimpleJitLimit = DEFAULT_CONFIG_SimpleJitLimit_OldSimpleJit - DEFAULT_CONFIG_ProfilingInterpreter0Limit;
                ProfilingInterpreter1Limit = 0;
                VerifyExecutionModeLimits();
            }

            if (IsEnabled(SimpleJitAfterFlag))
            {
                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(EnforceExecutionModeLimitsFlag);

                {
                    Js::Number iterationsNeeded = SimpleJitAfter;
                    ProfilingInterpreter0Limit = min(ProfilingInterpreter0Limit, iterationsNeeded);
                    iterationsNeeded -= ProfilingInterpreter0Limit;
                    AutoProfilingInterpreter0Limit = iterationsNeeded;
                    AutoProfilingInterpreter1Limit = 0;
                }

                if(IsEnabled(FullJitAfterFlag))
                {
                    Enable(SimpleJitLimitFlag);
                    Enable(ProfilingInterpreter1LimitFlag);

                    Assert(SimpleJitAfter <= FullJitAfter);
                    Js::Number iterationsNeeded = FullJitAfter - SimpleJitAfter;
                    Js::Number profilingIterationsNeeded =
                        min(NewSimpleJit
                                ? DEFAULT_CONFIG_MinProfileIterations
                                : DEFAULT_CONFIG_MinProfileIterations_OldSimpleJit,
                            FullJitAfter) -
                        ProfilingInterpreter0Limit;
                    if(NewSimpleJit)
                    {
                        ProfilingInterpreter1Limit = min(ProfilingInterpreter1Limit, iterationsNeeded);
                        iterationsNeeded -= ProfilingInterpreter1Limit;
                        profilingIterationsNeeded -= ProfilingInterpreter1Limit;
                        SimpleJitLimit = iterationsNeeded;
                    }
                    else
                    {
                        SimpleJitLimit = iterationsNeeded;
                        profilingIterationsNeeded -= min(SimpleJitLimit, profilingIterationsNeeded);
                        ProfilingInterpreter1Limit = 0;
                    }

                    if(profilingIterationsNeeded != 0)
                    {
                        Js::Number iterationsToMove = min(AutoProfilingInterpreter1Limit, profilingIterationsNeeded);
                        AutoProfilingInterpreter1Limit -= iterationsToMove;
                        ProfilingInterpreter0Limit += iterationsToMove;
                        profilingIterationsNeeded -= iterationsToMove;

                        iterationsToMove = min(AutoProfilingInterpreter0Limit, profilingIterationsNeeded);
                        AutoProfilingInterpreter0Limit -= iterationsToMove;
                        ProfilingInterpreter0Limit += iterationsToMove;
                        profilingIterationsNeeded -= iterationsToMove;

                        Assert(profilingIterationsNeeded == 0);
                    }

                    Assert(
                        (
                            AutoProfilingInterpreter0Limit +
                            ProfilingInterpreter0Limit +
                            AutoProfilingInterpreter1Limit +
                            SimpleJitLimit +
                            ProfilingInterpreter1Limit
                        ) == FullJitAfter);
                }

                Assert(
                    (
                        AutoProfilingInterpreter0Limit +
                        ProfilingInterpreter0Limit +
                        AutoProfilingInterpreter1Limit
                    ) == SimpleJitAfter);
                EnforceExecutionModeLimits = true;
                break;
            }

            if(IsEnabled(FullJitAfterFlag))
            {
                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);
                Enable(EnforceExecutionModeLimitsFlag);

                Js::Number iterationsNeeded = FullJitAfter;
                if(NewSimpleJit)
                {
                    ProfilingInterpreter1Limit = min(ProfilingInterpreter1Limit, iterationsNeeded);
                    iterationsNeeded -= ProfilingInterpreter1Limit;
                }
                else
                {
                    ProfilingInterpreter1Limit = 0;
                    SimpleJitLimit = min(SimpleJitLimit, iterationsNeeded);
                    iterationsNeeded -= SimpleJitLimit;
                }
                ProfilingInterpreter0Limit = min(ProfilingInterpreter0Limit, iterationsNeeded);
                iterationsNeeded -= ProfilingInterpreter0Limit;
                if(NewSimpleJit)
                {
                    SimpleJitLimit = min(SimpleJitLimit, iterationsNeeded);
                    iterationsNeeded -= SimpleJitLimit;
                }
                AutoProfilingInterpreter0Limit = min(AutoProfilingInterpreter0Limit, iterationsNeeded);
                iterationsNeeded -= AutoProfilingInterpreter0Limit;
                AutoProfilingInterpreter1Limit = iterationsNeeded;

                Assert(
                    (
                        AutoProfilingInterpreter0Limit +
                        ProfilingInterpreter0Limit +
                        AutoProfilingInterpreter1Limit +
                        SimpleJitLimit +
                        ProfilingInterpreter1Limit
                    ) == FullJitAfter);
                EnforceExecutionModeLimits = true;
                break;
            }
            if (IsEnabled(MaxTemplatizedJitRunCountFlag))
            {
                if (MaxTemplatizedJitRunCount >= 0)
                {
                    MinTemplatizedJitRunCount = MaxTemplatizedJitRunCount;
                }
            }
            if (IsEnabled(MaxAsmJsInterpreterRunCountFlag))
            {
                if (MaxAsmJsInterpreterRunCount >= 0)
                {
                    MinAsmJsInterpreterRunCount = MaxAsmJsInterpreterRunCount;
                }
            }

        } while(false);
    #endif

        if( (
            #ifdef ENABLE_PREJIT
                Prejit ||
            #endif
                ForceNative
            ) &&
            !NoNative)
        {
            Enable(AutoProfilingInterpreter0LimitFlag);
            Enable(ProfilingInterpreter0LimitFlag);
            Enable(AutoProfilingInterpreter1LimitFlag);
            Enable(EnforceExecutionModeLimitsFlag);

            // Override any relevant automatic configuration above
            AutoProfilingInterpreter0Limit = 0;
            ProfilingInterpreter0Limit = 0;
            AutoProfilingInterpreter1Limit = 0;
        #if ENABLE_DEBUG_CONFIG_OPTIONS
            if(Off.IsEnabled(SimpleJitPhase))
            {
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);

                SimpleJitLimit = 0;
                ProfilingInterpreter1Limit = 0;
            }
        #endif

            EnforceExecutionModeLimits = true;
        }

        VerifyExecutionModeLimits();
    }